

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O3

void amqp_maybe_release_buffers_on_channel(amqp_connection_state_t state,amqp_channel_t channel)

{
  amqp_link_t *paVar1;
  amqp_pool_t *pool;
  
  if (state->state == CONNECTION_STATE_IDLE) {
    paVar1 = (amqp_link_t *)&state->first_queued_frame;
    do {
      paVar1 = paVar1->next;
      if (paVar1 == (amqp_link_t *)0x0) {
        pool = amqp_get_channel_pool(state,channel);
        if (pool == (amqp_pool_t *)0x0) {
          return;
        }
        recycle_amqp_pool(pool);
        return;
      }
    } while (*(amqp_channel_t *)((long)paVar1->data + 2) != channel);
  }
  return;
}

Assistant:

void amqp_maybe_release_buffers_on_channel(amqp_connection_state_t state,
                                           amqp_channel_t channel) {
  amqp_link_t *queued_link;
  amqp_pool_t *pool;
  if (CONNECTION_STATE_IDLE != state->state) {
    return;
  }

  queued_link = state->first_queued_frame;

  while (NULL != queued_link) {
    amqp_frame_t *frame = queued_link->data;
    if (channel == frame->channel) {
      return;
    }

    queued_link = queued_link->next;
  }

  pool = amqp_get_channel_pool(state, channel);

  if (pool != NULL) {
    recycle_amqp_pool(pool);
  }
}